

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O2

boolean donning_off(obj *otmp)

{
  bool bVar1;
  bool bVar2;
  
  if (uarm == otmp) {
    bVar1 = afternmv == Armor_off;
    bVar2 = taking_off == 1;
  }
  else if (uarmu == otmp) {
    bVar1 = afternmv == Shirt_off;
    bVar2 = taking_off == 0x40;
  }
  else if (uarmc == otmp) {
    bVar1 = afternmv == Cloak_off;
    bVar2 = taking_off == 2;
  }
  else if (uarmf == otmp) {
    bVar1 = afternmv == Boots_off;
    bVar2 = taking_off == 0x20;
  }
  else if (uarmh == otmp) {
    bVar1 = afternmv == Helmet_off;
    bVar2 = taking_off == 4;
  }
  else if (uarmg == otmp) {
    bVar1 = afternmv == Gloves_off;
    bVar2 = taking_off == 0x10;
  }
  else {
    if (uarms != otmp) {
      return '\0';
    }
    bVar1 = afternmv == Shield_off;
    bVar2 = taking_off == 8;
  }
  return bVar2 | bVar1;
}

Assistant:

boolean donning_off(const struct obj *otmp)
{
	/* if taking_off is non-zero, occupation is implied */
	if (otmp == uarm)
	    return (afternmv == Armor_off || taking_off == WORN_ARMOR);
	if (otmp == uarmu)
	    return (afternmv == Shirt_off || taking_off == WORN_SHIRT);
	if (otmp == uarmc)
	    return (afternmv == Cloak_off || taking_off == WORN_CLOAK);
	if (otmp == uarmf)
	    return (afternmv == Boots_off || taking_off == WORN_BOOTS);
	if (otmp == uarmh)
	    return (afternmv == Helmet_off || taking_off == WORN_HELMET);
	if (otmp == uarmg)
	    return (afternmv == Gloves_off || taking_off == WORN_GLOVES);
	if (otmp == uarms)
	    return (afternmv == Shield_off || taking_off == WORN_SHIELD);
	return FALSE;
}